

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v5::internal::
       parse_width<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
                 *handler)

{
  uint width;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
  *in_RDX;
  specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RSI;
  specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDI;
  char *in_stack_ffffffffffffffb8;
  specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_ffffffffffffffc0;
  specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *psVar1;
  specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>
  *in_stack_ffffffffffffffc8;
  width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>_&,_char>
  in_stack_ffffffffffffffd8;
  specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *end_00;
  char *in_stack_fffffffffffffff8;
  
  if ((*(char *)&(in_RDI->super_specs_setter<char>).specs_ < '0') ||
     ('9' < *(char *)&(in_RDI->super_specs_setter<char>).specs_)) {
    if (*(char *)&(in_RDI->super_specs_setter<char>).specs_ == '{') {
      psVar1 = (specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                *)((long)&(in_RDI->super_specs_setter<char>).specs_ + 1);
      in_RDI = psVar1;
      if (psVar1 != in_RSI) {
        end_00 = psVar1;
        width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>_&,_char>
        ::width_adapter((width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>_&,_char>
                         *)&stack0xffffffffffffffd8,in_RDX);
        in_RDI = (specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                  *)parse_arg_id<char,fmt::v5::internal::width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&,char>>
                              (in_stack_fffffffffffffff8,(char *)end_00,
                               (width_adapter<fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>_>_&,_char>
                                *)in_RSI);
        in_stack_ffffffffffffffc0 = psVar1;
      }
      if ((in_RDI == in_RSI) || (*(char *)&(in_RDI->super_specs_setter<char>).specs_ != '}')) {
        specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
        ::on_error(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      }
      else {
        in_RDI = (specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                  *)((long)&(in_RDI->super_specs_setter<char>).specs_ + 1);
      }
    }
  }
  else {
    width = parse_nonnegative_int<char,fmt::v5::internal::specs_checker<fmt::v5::internal::specs_handler<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>>&>
                      ((char **)in_stack_ffffffffffffffd8.handler,(char *)in_RDX,
                       in_stack_ffffffffffffffc8);
    specs_setter<char>::on_width((specs_setter<char> *)in_RDX,width);
  }
  return (char *)in_RDI;
}

Assistant:

FMT_CONSTEXPR const Char *parse_width(
    const Char *begin, const Char *end, Handler &&handler) {
  FMT_ASSERT(begin != end, "");
  if ('0' <= *begin && *begin <= '9') {
    handler.on_width(parse_nonnegative_int(begin, end, handler));
  } else if (*begin == '{') {
    ++begin;
    if (begin != end)
      begin = parse_arg_id(begin, end, width_adapter<Handler, Char>(handler));
    if (begin == end || *begin != '}')
      return handler.on_error("invalid format string"), begin;
    ++begin;
  }
  return begin;
}